

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

string * PSBTRoleName_abi_cxx11_(string *__return_storage_ptr__,PSBTRole role)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  switch(role) {
  case CREATOR:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00da39b5:
      __stack_chk_fail();
    }
    pcVar3 = "creator";
    pcVar2 = "";
    break;
  case UPDATER:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00da39b5;
    pcVar3 = "updater";
    pcVar2 = "";
    break;
  case SIGNER:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00da39b5;
    pcVar3 = "signer";
    pcVar2 = "";
    break;
  case FINALIZER:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00da39b5;
    pcVar3 = "finalizer";
    pcVar2 = "";
    break;
  case EXTRACTOR:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00da39b5;
    pcVar3 = "extractor";
    pcVar2 = "";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/psbt.cpp"
                  ,0x215,"std::string PSBTRoleName(PSBTRole)");
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string PSBTRoleName(PSBTRole role) {
    switch (role) {
    case PSBTRole::CREATOR: return "creator";
    case PSBTRole::UPDATER: return "updater";
    case PSBTRole::SIGNER: return "signer";
    case PSBTRole::FINALIZER: return "finalizer";
    case PSBTRole::EXTRACTOR: return "extractor";
        // no default case, so the compiler can warn about missing cases
    }
    assert(false);
}